

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O0

void jsimd_h2v1_fancy_upsample
               (j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY *output_data_ptr)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  
  if ((simd_support & 0x80) == 0) {
    jsimd_h2v1_fancy_upsample_sse2
              (*(undefined4 *)(in_RDI + 0x19c),*(undefined4 *)(in_RSI + 0x28),in_RDX,in_RCX);
  }
  else {
    jsimd_h2v1_fancy_upsample_avx2
              (*(undefined4 *)(in_RDI + 0x19c),*(undefined4 *)(in_RSI + 0x28),in_RDX,in_RCX);
  }
  return;
}

Assistant:

GLOBAL(void)
jsimd_h2v1_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                          JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  if (simd_support & JSIMD_AVX2)
    jsimd_h2v1_fancy_upsample_avx2(cinfo->max_v_samp_factor,
                                   compptr->downsampled_width, input_data,
                                   output_data_ptr);
  else
    jsimd_h2v1_fancy_upsample_sse2(cinfo->max_v_samp_factor,
                                   compptr->downsampled_width, input_data,
                                   output_data_ptr);
}